

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.h
# Opt level: O0

OLECHAR * __thiscall Js::CharClassifier::SkipWhiteSpace(CharClassifier *this,LPCOLESTR psz)

{
  OLECHAR OVar1;
  bool bVar2;
  char16 firstChar;
  LPCOLESTR psz_local;
  CharClassifier *this_local;
  
  OVar1 = *psz;
  this_local = (CharClassifier *)psz;
  if ((OVar1 != L'\0') &&
     ((bVar2 = IsWhiteSpace(this,(uint)(ushort)OVar1), bVar2 ||
      ((this->skipWhiteSpaceFunc == SkipWhiteSpaceSurrogate &&
       (bVar2 = NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar1), bVar2)))))) {
    this_local = (CharClassifier *)(*this->skipWhiteSpaceFunc)(psz,this);
  }
  return (OLECHAR *)this_local;
}

Assistant:

const OLECHAR* SkipWhiteSpace(LPCOLESTR psz) const
        {
            // Fast path for the case in which first character is not space
            char16 firstChar = *psz;
            if (firstChar == 0)
            {
                return psz;
            }
            if (!this->IsWhiteSpace(firstChar) &&
                (skipWhiteSpaceFunc != &SkipWhiteSpaceSurrogate
                || !Js::NumberUtilities::IsSurrogateLowerPart(firstChar)))
            {
                return psz;
            }
            return skipWhiteSpaceFunc(psz, this);
        }